

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sounddecoder.c
# Opt level: O1

void runSoundDecoder(int *stop)

{
  size_t sVar1;
  
  if (*stop == 0) {
    do {
      if (driver == DRIVER_ALSA) {
        buffer_read = alsa_read(pcm,buffer,buffer_l);
      }
      else if (driver == DRIVER_PULSE) {
        buffer_read = pulseaudio_read(pa_dev,buffer,buffer_l,(uchar)channels);
      }
      else if (driver == DRIVER_FILE) {
        sVar1 = fread(buffer,(ulong)(uint)channels * 2,(long)buffer_l,(FILE *)fp);
        buffer_read = (int)sVar1;
        if (buffer_read < 1) {
          *stop = 1;
        }
      }
      if (0 < buffer_read) {
        if ((rx_a != (receiver *)0x0) && (sound_channels != SOUND_CHANNELS_RIGHT)) {
          receiver_run(rx_a,buffer,buffer_read);
        }
        if ((rx_b != (receiver *)0x0) &&
           ((sound_channels & ~SOUND_CHANNELS_LEFT) == SOUND_CHANNELS_STEREO)) {
          receiver_run(rx_b,buffer,buffer_read);
        }
      }
    } while (*stop == 0);
    return;
  }
  return;
}

Assistant:

void runSoundDecoder(int *stop) {
#ifdef WIN32
    waveInStart(winmm_device);
#endif
    while (!*stop) {
        switch (driver) {
        case DRIVER_FILE:
            buffer_read = fread(buffer, channels * sizeof(short), buffer_l, fp);
            if (buffer_read <= 0) *stop = 1;
            break;

#ifdef HAVE_PULSEAUDIO
        case DRIVER_PULSE:
            buffer_read = pulseaudio_read(pa_dev, buffer, buffer_l, channels);
            break;
#endif
#ifdef HAVE_ALSA
        case DRIVER_ALSA:
            buffer_read = alsa_read(pcm, buffer, buffer_l);
            break;
#endif
#ifdef WIN32
        case DRIVER_WINMM:
            buffer_read=0;
            switch(WaitForSingleObject(winmm_event, 2000)) {
            case WAIT_TIMEOUT:
                buffer_read=0;
                break;
            case WAIT_OBJECT_0:
                buffer_read = winmm_getRecorded(&winmm_device, (char*)buffer);
                break;
            }
            break;
            ResetEvent(winmm_event);
#endif
        }
        readBuffers();
    }
#ifdef WIN32
    waveInStop(winmm_device);
#endif
}